

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

int run_test_tcp_close_reset_client(void)

{
  int iVar1;
  int iVar2;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_loop_t *loop;
  uv_tcp_t *in_RSI;
  uv_tcp_t *puVar3;
  uv_tcp_t *puVar4;
  uv_loop_t *puVar5;
  uv_stream_t *server;
  int64_t eval_b;
  int64_t eval_a;
  void *pvStack_c8;
  undefined1 auStack_c0 [16];
  undefined1 auStack_b0 [16];
  uv__queue *puStack_a0;
  undefined1 auStack_98 [16];
  uv__queue *puStack_88;
  undefined1 auStack_80 [16];
  uv__queue *puStack_70;
  undefined1 auStack_68 [32];
  uv_loop_t *puStack_48;
  uv_connect_t *puStack_40;
  undefined1 auStack_38 [24];
  uv_loop_t *puStack_20;
  anon_union_8_2_bf76bca6_for_active_reqs local_18;
  uv_connect_t *local_10;
  
  puStack_20 = (uv_loop_t *)0x1c519e;
  ::loop = uv_default_loop();
  puStack_20 = (uv_loop_t *)0x1c51ad;
  start_server(::loop,in_RSI);
  client_close = 1;
  shutdown_before_close = 0;
  puStack_20 = (uv_loop_t *)0x1c51ca;
  do_connect(::loop,in_RSI);
  local_10 = (uv_connect_t *)(long)write_cb_called;
  local_18.unused = (void *)0x0;
  if (local_10 == (uv_connect_t *)0x0) {
    local_10 = (uv_connect_t *)(long)close_cb_called;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c532a;
    local_10 = (uv_connect_t *)(long)shutdown_cb_called;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c5337;
    puStack_20 = (uv_loop_t *)0x1c5241;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    local_10 = (uv_connect_t *)(long)iVar1;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c5344;
    local_10 = (uv_connect_t *)0x4;
    local_18 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)write_cb_called;
    if (local_18.unused != (void *)0x4) goto LAB_001c5351;
    local_10 = (uv_connect_t *)0x1;
    local_18 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)close_cb_called;
    if (local_18.unused != (void *)0x1) goto LAB_001c535e;
    local_10 = (uv_connect_t *)(long)shutdown_cb_called;
    local_18.unused = (void *)0x0;
    if (local_10 != (uv_connect_t *)0x0) goto LAB_001c536b;
    puStack_20 = (uv_loop_t *)0x1c52e0;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_20 = (uv_loop_t *)0x1c52ea;
    uv_run(puVar5,UV_RUN_DEFAULT);
    local_10 = (uv_connect_t *)0x0;
    puStack_20 = (uv_loop_t *)0x1c52ff;
    iVar1 = uv_loop_close(::loop);
    local_18 = (anon_union_8_2_bf76bca6_for_active_reqs)(long)iVar1;
    unaff_RBX = puVar5;
    if (local_10 == (uv_connect_t *)local_18.unused) {
      puStack_20 = (uv_loop_t *)0x1c5315;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x1c532a;
    run_test_tcp_close_reset_client_cold_1();
LAB_001c532a:
    puStack_20 = (uv_loop_t *)0x1c5337;
    run_test_tcp_close_reset_client_cold_2();
LAB_001c5337:
    puStack_20 = (uv_loop_t *)0x1c5344;
    run_test_tcp_close_reset_client_cold_3();
LAB_001c5344:
    puStack_20 = (uv_loop_t *)0x1c5351;
    run_test_tcp_close_reset_client_cold_4();
LAB_001c5351:
    puStack_20 = (uv_loop_t *)0x1c535e;
    run_test_tcp_close_reset_client_cold_5();
LAB_001c535e:
    puStack_20 = (uv_loop_t *)0x1c536b;
    run_test_tcp_close_reset_client_cold_6();
LAB_001c536b:
    puStack_20 = (uv_loop_t *)0x1c5378;
    run_test_tcp_close_reset_client_cold_7();
  }
  puVar5 = (uv_loop_t *)&stack0xfffffffffffffff0;
  puStack_20 = (uv_loop_t *)start_server;
  run_test_tcp_close_reset_client_cold_8();
  puStack_48 = (uv_loop_t *)0x1c53a3;
  puStack_20 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(auStack_38 + 8));
  auStack_38._0_8_ = SEXT48(iVar1);
  puStack_40 = (uv_connect_t *)0x0;
  if ((uv_shutdown_t *)auStack_38._0_8_ == (uv_shutdown_t *)0x0) {
    puStack_48 = (uv_loop_t *)0x1c53d0;
    iVar1 = uv_tcp_init(puVar5,&tcp_server);
    auStack_38._0_8_ = SEXT48(iVar1);
    puStack_40 = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_38._0_8_ != (uv_shutdown_t *)0x0) goto LAB_001c545c;
    puStack_48 = (uv_loop_t *)0x1c53fd;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)(auStack_38 + 8),0);
    auStack_38._0_8_ = SEXT48(iVar1);
    puStack_40 = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_38._0_8_ != (uv_shutdown_t *)0x0) goto LAB_001c5469;
    puStack_48 = (uv_loop_t *)0x1c542f;
    iVar1 = uv_listen((uv_stream_t *)&tcp_server,0x80,connection_cb);
    auStack_38._0_8_ = SEXT48(iVar1);
    puStack_40 = (uv_connect_t *)0x0;
    if ((uv_shutdown_t *)auStack_38._0_8_ == (uv_shutdown_t *)0x0) {
      return iVar1;
    }
  }
  else {
    puStack_48 = (uv_loop_t *)0x1c545c;
    start_server_cold_1();
LAB_001c545c:
    puStack_48 = (uv_loop_t *)0x1c5469;
    start_server_cold_2();
LAB_001c5469:
    puStack_48 = (uv_loop_t *)0x1c5476;
    start_server_cold_3();
  }
  loop = (uv_loop_t *)auStack_38;
  puStack_48 = (uv_loop_t *)do_connect;
  start_server_cold_4();
  puVar3 = (uv_tcp_t *)auStack_68;
  puStack_70 = (uv__queue *)0x1c54a1;
  puStack_48 = puVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(auStack_68 + 0x10));
  auStack_68._8_8_ = SEXT48(iVar1);
  auStack_68._0_8_ = (uv_connect_t *)0x0;
  if ((uv_loop_t *)auStack_68._8_8_ == (uv_loop_t *)0x0) {
    puStack_70 = (uv__queue *)0x1c54ca;
    iVar1 = uv_tcp_init(loop,&tcp_client);
    auStack_68._8_8_ = SEXT48(iVar1);
    auStack_68._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5530;
    puStack_70 = (uv__queue *)0x1c5503;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,(sockaddr *)(auStack_68 + 0x10),connect_cb);
    auStack_68._8_8_ = SEXT48(iVar1);
    auStack_68._0_8_ = (uv_connect_t *)0x0;
    if ((uv_loop_t *)auStack_68._8_8_ == (uv_loop_t *)0x0) {
      return iVar1;
    }
  }
  else {
    puStack_70 = (uv__queue *)0x1c5530;
    do_connect_cold_1();
LAB_001c5530:
    puStack_70 = (uv__queue *)0x1c553d;
    do_connect_cold_2();
  }
  puStack_70 = (uv__queue *)run_test_tcp_close_reset_client_after_shutdown;
  do_connect_cold_3();
  puVar4 = (uv_tcp_t *)auStack_80;
  puStack_88 = (uv__queue *)0x1c5554;
  puStack_70 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_88 = (uv__queue *)0x1c5563;
  start_server(::loop,puVar3);
  client_close = 1;
  shutdown_before_close = 1;
  puStack_88 = (uv__queue *)0x1c5580;
  do_connect(::loop,puVar3);
  auStack_80._8_8_ = SEXT48(write_cb_called);
  auStack_80._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_80._8_8_ == (uv_loop_t *)0x0) {
    auStack_80._8_8_ = SEXT48(close_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c56e0;
    auStack_80._8_8_ = SEXT48(shutdown_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c56ed;
    puStack_88 = (uv__queue *)0x1c55f7;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_80._8_8_ = SEXT48(iVar1);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c56fa;
    auStack_80._8_8_ = (uv_loop_t *)0x4;
    auStack_80._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_80._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5707;
    auStack_80._8_8_ = SEXT48(close_cb_called);
    auStack_80._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_80._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5714;
    auStack_80._8_8_ = (uv_loop_t *)0x1;
    auStack_80._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_80._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5721;
    puStack_88 = (uv__queue *)0x1c5696;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_88 = (uv__queue *)0x1c56a0;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_80._8_8_ = (uv_loop_t *)0x0;
    puStack_88 = (uv__queue *)0x1c56b5;
    iVar1 = uv_loop_close(::loop);
    auStack_80._0_8_ = SEXT48(iVar1);
    loop = puVar5;
    if (auStack_80._8_8_ == auStack_80._0_8_) {
      puStack_88 = (uv__queue *)0x1c56cb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_88 = (uv__queue *)0x1c56e0;
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_001c56e0:
    puStack_88 = (uv__queue *)0x1c56ed;
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_001c56ed:
    puStack_88 = (uv__queue *)0x1c56fa;
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_001c56fa:
    puStack_88 = (uv__queue *)0x1c5707;
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_001c5707:
    puStack_88 = (uv__queue *)0x1c5714;
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_001c5714:
    puStack_88 = (uv__queue *)0x1c5721;
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_001c5721:
    puStack_88 = (uv__queue *)0x1c572e;
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  puStack_88 = (uv__queue *)run_test_tcp_close_reset_accepted;
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  puVar3 = (uv_tcp_t *)auStack_98;
  puStack_a0 = (uv__queue *)0x1c5745;
  puStack_88 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  puStack_a0 = (uv__queue *)0x1c5754;
  start_server(::loop,puVar4);
  client_close = 0;
  shutdown_before_close = 0;
  puStack_a0 = (uv__queue *)0x1c5771;
  do_connect(::loop,puVar4);
  auStack_98._8_8_ = SEXT48(write_cb_called);
  auStack_98._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_98._8_8_ == (uv_loop_t *)0x0) {
    auStack_98._8_8_ = SEXT48(close_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c58d1;
    auStack_98._8_8_ = SEXT48(shutdown_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c58de;
    puStack_a0 = (uv__queue *)0x1c57e8;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_98._8_8_ = SEXT48(iVar1);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c58eb;
    auStack_98._8_8_ = (uv_loop_t *)0x4;
    auStack_98._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_98._0_8_ != (uv_loop_t *)0x4) goto LAB_001c58f8;
    auStack_98._8_8_ = (uv_loop_t *)0x1;
    auStack_98._0_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_98._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5905;
    auStack_98._8_8_ = SEXT48(shutdown_cb_called);
    auStack_98._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_98._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5912;
    puStack_a0 = (uv__queue *)0x1c5887;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    puStack_a0 = (uv__queue *)0x1c5891;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_98._8_8_ = (uv_loop_t *)0x0;
    puStack_a0 = (uv__queue *)0x1c58a6;
    iVar1 = uv_loop_close(::loop);
    auStack_98._0_8_ = SEXT48(iVar1);
    loop = puVar5;
    if (auStack_98._8_8_ == auStack_98._0_8_) {
      puStack_a0 = (uv__queue *)0x1c58bc;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_a0 = (uv__queue *)0x1c58d1;
    run_test_tcp_close_reset_accepted_cold_1();
LAB_001c58d1:
    puStack_a0 = (uv__queue *)0x1c58de;
    run_test_tcp_close_reset_accepted_cold_2();
LAB_001c58de:
    puStack_a0 = (uv__queue *)0x1c58eb;
    run_test_tcp_close_reset_accepted_cold_3();
LAB_001c58eb:
    puStack_a0 = (uv__queue *)0x1c58f8;
    run_test_tcp_close_reset_accepted_cold_4();
LAB_001c58f8:
    puStack_a0 = (uv__queue *)0x1c5905;
    run_test_tcp_close_reset_accepted_cold_5();
LAB_001c5905:
    puStack_a0 = (uv__queue *)0x1c5912;
    run_test_tcp_close_reset_accepted_cold_6();
LAB_001c5912:
    puStack_a0 = (uv__queue *)0x1c591f;
    run_test_tcp_close_reset_accepted_cold_7();
  }
  puStack_a0 = (uv__queue *)run_test_tcp_close_reset_accepted_after_shutdown;
  run_test_tcp_close_reset_accepted_cold_8();
  puVar4 = (uv_tcp_t *)auStack_b0;
  auStack_c0._8_8_ = (uv_loop_t *)0x1c5936;
  puStack_a0 = (uv__queue *)loop;
  ::loop = uv_default_loop();
  auStack_c0._8_8_ = (uv_loop_t *)0x1c5945;
  start_server(::loop,puVar3);
  client_close = 0;
  shutdown_before_close = 1;
  auStack_c0._8_8_ = (uv_loop_t *)0x1c5962;
  do_connect(::loop,puVar3);
  auStack_b0._8_8_ = SEXT48(write_cb_called);
  auStack_b0._0_8_ = (uv_loop_t *)0x0;
  if ((uv_loop_t *)auStack_b0._8_8_ == (uv_loop_t *)0x0) {
    auStack_b0._8_8_ = SEXT48(close_cb_called);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5ac2;
    auStack_b0._8_8_ = SEXT48(shutdown_cb_called);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5acf;
    auStack_c0._8_8_ = (uv_loop_t *)0x1c59d9;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_b0._8_8_ = SEXT48(iVar1);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5adc;
    auStack_b0._8_8_ = (uv_loop_t *)0x4;
    auStack_b0._0_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_b0._0_8_ != (uv_loop_t *)0x4) goto LAB_001c5ae9;
    auStack_b0._8_8_ = SEXT48(close_cb_called);
    auStack_b0._0_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_b0._8_8_ != (uv_loop_t *)0x0) goto LAB_001c5af6;
    auStack_b0._8_8_ = (uv_loop_t *)0x1;
    auStack_b0._0_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_b0._0_8_ != (uv_loop_t *)0x1) goto LAB_001c5b03;
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5a78;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5a82;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_b0._8_8_ = (uv_loop_t *)0x0;
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5a97;
    iVar1 = uv_loop_close(::loop);
    auStack_b0._0_8_ = SEXT48(iVar1);
    loop = puVar5;
    if (auStack_b0._8_8_ == auStack_b0._0_8_) {
      auStack_c0._8_8_ = (uv_loop_t *)0x1c5aad;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5ac2;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c5ac2:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5acf;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c5acf:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5adc;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c5adc:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5ae9;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c5ae9:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5af6;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c5af6:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5b03;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c5b03:
    auStack_c0._8_8_ = (uv_loop_t *)0x1c5b10;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  auStack_c0._8_8_ = run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar1 = (int)&pvStack_c8;
  auStack_c0._8_8_ = loop;
  ::loop = uv_default_loop();
  start_server(::loop,puVar4);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(::loop,puVar4);
  auStack_c0._0_8_ = SEXT48(write_cb_called);
  pvStack_c8 = (void *)0x0;
  if ((void *)auStack_c0._0_8_ == (void *)0x0) {
    auStack_c0._0_8_ = SEXT48(close_cb_called);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c5cb3;
    auStack_c0._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c5cc0;
    iVar2 = uv_run(::loop,UV_RUN_DEFAULT);
    puVar5 = ::loop;
    auStack_c0._0_8_ = SEXT48(iVar2);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c5ccd;
    auStack_c0._0_8_ = (void *)0x4;
    pvStack_c8 = (void *)(long)write_cb_called;
    if (pvStack_c8 != (void *)0x4) goto LAB_001c5cda;
    auStack_c0._0_8_ = (void *)0x1;
    pvStack_c8 = (void *)(long)close_cb_called;
    if (pvStack_c8 != (void *)0x1) goto LAB_001c5ce7;
    auStack_c0._0_8_ = SEXT48(shutdown_cb_called);
    pvStack_c8 = (void *)0x0;
    if ((void *)auStack_c0._0_8_ != (void *)0x0) goto LAB_001c5cf4;
    uv_walk(::loop,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_c0._0_8_ = (void *)0x0;
    iVar2 = uv_loop_close(::loop);
    pvStack_c8 = (void *)(long)iVar2;
    if ((void *)auStack_c0._0_8_ == pvStack_c8) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c5cb3:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c5cc0:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c5ccd:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c5cda:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c5ce7:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c5cf4:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  server = (uv_stream_t *)auStack_c0;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept(server,(uv_stream_t *)&tcp_accepted);
      if (iVar1 == 0) {
        iVar1 = uv_read_start((uv_stream_t *)&tcp_accepted,alloc_cb,read_cb);
        return iVar1;
      }
      goto LAB_001c5dc0;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c5dc0:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x399040;
}

Assistant:

TEST_IMPL(tcp_close_reset_client) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 1;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_EQ(1, close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}